

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3Double.h
# Opt level: O3

void __thiscall DIS::EntityStatePdu::setEntityLocation(EntityStatePdu *this,Vector3Double *pX)

{
  double dVar1;
  
  (this->_entityLocation)._z = pX->_z;
  dVar1 = pX->_y;
  (this->_entityLocation)._x = pX->_x;
  (this->_entityLocation)._y = dVar1;
  return;
}

Assistant:

class OPENDIS7_EXPORT Vector3Double
{
protected:
  /** X value */
  double _x; 

  /** y Value */
  double _y; 

  /** Z value */
  double _z; 


 public:
    Vector3Double();
    virtual ~Vector3Double();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    double getX() const; 
    void setX(double pX); 

    double getY() const; 
    void setY(double pX); 

    double getZ() const; 
    void setZ(double pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const Vector3Double& rhs) const;
}